

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O0

void tc_uECC_vli_mult(tc_uECC_word_t *result,tc_uECC_word_t *left,tc_uECC_word_t *right,
                     wordcount_t num_words)

{
  char local_32;
  char local_31;
  tc_uECC_word_t local_30;
  wordcount_t k;
  tc_uECC_word_t tStack_2c;
  wordcount_t i;
  tc_uECC_word_t r2;
  tc_uECC_word_t r1;
  tc_uECC_word_t r0;
  wordcount_t num_words_local;
  tc_uECC_word_t *right_local;
  tc_uECC_word_t *left_local;
  tc_uECC_word_t *result_local;
  
  r2 = 0;
  tStack_2c = 0;
  r1._3_1_ = num_words;
  _r0 = right;
  right_local = left;
  left_local = result;
  for (local_32 = '\0'; local_30 = 0, local_32 < r1._3_1_; local_32 = local_32 + '\x01') {
    for (local_31 = '\0'; local_31 <= local_32; local_31 = local_31 + '\x01') {
      muladd(right_local[local_31],_r0[(int)local_32 - (int)local_31],&r2,&stack0xffffffffffffffd4,
             &local_30);
    }
    left_local[local_32] = r2;
    r2 = tStack_2c;
    tStack_2c = local_30;
  }
  for (local_32 = r1._3_1_; local_30 = 0, (int)local_32 < r1._3_1_ * 2 + -1;
      local_32 = local_32 + '\x01') {
    for (local_31 = (local_32 + '\x01') - r1._3_1_; local_31 < r1._3_1_;
        local_31 = local_31 + '\x01') {
      muladd(right_local[local_31],_r0[(int)local_32 - (int)local_31],&r2,&stack0xffffffffffffffd4,
             &local_30);
    }
    left_local[local_32] = r2;
    r2 = tStack_2c;
    tStack_2c = local_30;
  }
  left_local[r1._3_1_ * 2 + -1] = r2;
  return;
}

Assistant:

static void tc_uECC_vli_mult(tc_uECC_word_t *result, const tc_uECC_word_t *left,
			  const tc_uECC_word_t *right, wordcount_t num_words)
{

	tc_uECC_word_t r0 = 0;
	tc_uECC_word_t r1 = 0;
	tc_uECC_word_t r2 = 0;
	wordcount_t i, k;

	/* Compute each digit of result in sequence, maintaining the carries. */
	for (k = 0; k < num_words; ++k) {

		for (i = 0; i <= k; ++i) {
			muladd(left[i], right[k - i], &r0, &r1, &r2);
		}

		result[k] = r0;
		r0 = r1;
		r1 = r2;
		r2 = 0;
	}

	for (k = num_words; k < num_words * 2 - 1; ++k) {

		for (i = (k + 1) - num_words; i < num_words; ++i) {
			muladd(left[i], right[k - i], &r0, &r1, &r2);
		}
		result[k] = r0;
		r0 = r1;
		r1 = r2;
		r2 = 0;
	}
	result[num_words * 2 - 1] = r0;
}